

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::ShaderRenderCaseInstance::SparseContext::SparseContext
          (SparseContext *this,Context *context)

{
  VkDevice_s *pVVar1;
  DestroyDeviceFunc p_Var2;
  VkAllocationCallbacks *pVVar3;
  InstanceInterface *pIVar4;
  VkPhysicalDevice physicalDevice;
  long lVar5;
  VkQueue pVVar6;
  Allocator *pAVar7;
  NotSupportedError *this_00;
  ulong uVar8;
  size_t queueNdx;
  long lVar9;
  _Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> local_68;
  RefBase<vk::VkDevice_s_*> local_48;
  
  this->m_context = context;
  pIVar4 = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceQueueFamilyProperties
            ((vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> *)
             &local_68,pIVar4,physicalDevice);
  lVar5 = (long)local_68._M_impl.super__Vector_impl_data._M_finish -
          (long)local_68._M_impl.super__Vector_impl_data._M_start;
  uVar8 = lVar5 % 0x18;
  lVar9 = 0;
  while( true ) {
    if (lVar5 / 0x18 == lVar9) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38,0x18,uVar8);
      tcu::NotSupportedError::NotSupportedError
                (this_00,"No matching queue found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                 ,0x26e);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    uVar8 = (ulong)~(local_68._M_impl.super__Vector_impl_data._M_start)->queueFlags;
    if ((~(local_68._M_impl.super__Vector_impl_data._M_start)->queueFlags & 9) == 0) break;
    lVar9 = lVar9 + 1;
    local_68._M_impl.super__Vector_impl_data._M_start =
         local_68._M_impl.super__Vector_impl_data._M_start + 1;
  }
  std::_Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>::
  ~_Vector_base(&local_68);
  this->m_queueFamilyIndex = (deUint32)lVar9;
  createDevice((Move<vk::VkDevice_s_*> *)&local_48,this);
  pVVar3 = local_48.m_data.deleter.m_allocator;
  p_Var2 = local_48.m_data.deleter.m_destroyDevice;
  pVVar1 = local_48.m_data.object;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_48.m_data.deleter.m_allocator;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)local_48.m_data.object;
  local_68._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_48.m_data.deleter.m_destroyDevice;
  local_48.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_48.m_data.object = (VkDevice_s *)0x0;
  local_48.m_data.deleter.m_destroyDevice = (DestroyDeviceFunc)0x0;
  (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator = pVVar3;
  (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object = pVVar1;
  (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice = p_Var2;
  ::vk::refdetails::RefBase<vk::VkDevice_s_*>::~RefBase(&local_48);
  pIVar4 = Context::getInstanceInterface(context);
  ::vk::DeviceDriver::DeviceDriver
            (&this->m_deviceInterface,pIVar4,
             (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object);
  pVVar6 = ::vk::getDeviceQueue
                     (&(this->m_deviceInterface).super_DeviceInterface,
                      (this->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object,
                      this->m_queueFamilyIndex,0);
  this->m_queue = pVVar6;
  pAVar7 = createAllocator(this);
  (this->m_allocator).super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr
       = pAVar7;
  return;
}

Assistant:

ShaderRenderCaseInstance::SparseContext::SparseContext (vkt::Context& context)
	: m_context				(context)
	, m_queueFamilyIndex	(findQueueFamilyIndexWithCaps(context.getInstanceInterface(), context.getPhysicalDevice(), VK_QUEUE_GRAPHICS_BIT|VK_QUEUE_SPARSE_BINDING_BIT))
	, m_device				(createDevice())
	, m_deviceInterface		(context.getInstanceInterface(), *m_device)
	, m_queue				(getDeviceQueue(m_deviceInterface, *m_device, m_queueFamilyIndex, 0))
	, m_allocator			(createAllocator())
{
}